

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O2

void __thiscall diy::AMRLink::save(AMRLink *this,BinaryBuffer *bb)

{
  Serialization<std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>::save
            (bb,&(this->super_Registrar<diy::AMRLink>).super_Link.neighbors_);
  (*bb->_vptr_BinaryBuffer[2])(bb,&this->dim_,4);
  Serialization<diy::AMRLink::Description>::save(bb,&this->local_);
  Serialization<std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>_>
  ::save(bb,&this->nbr_descriptions_);
  Serialization<std::vector<diy::Direction,_std::allocator<diy::Direction>_>_>::save
            (bb,&this->wrap_);
  return;
}

Assistant:

void          save(BinaryBuffer& bb) const override
      {
          Link::save(bb);
          diy::save(bb, dim_);
          diy::save(bb, local_);
          diy::save(bb, nbr_descriptions_);
          diy::save(bb, wrap_);
      }